

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O2

BlindingKeyResponseStruct *
cfd::js::api::ElementsTransactionStructApi::GetDefaultBlindingKey
          (BlindingKeyResponseStruct *__return_storage_ptr__,
          GetDefaultBlindingKeyRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetDefaultBlindingKeyRequestStruct_&)>
  local_f8;
  BlindingKeyResponseStruct local_d8;
  
  BlindingKeyResponseStruct::BlindingKeyResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetDefaultBlindingKeyRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:2122:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetDefaultBlindingKeyRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:2122:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"GetDefaultBlindingKey",&local_119);
  ExecuteStructApi<cfd::js::api::GetDefaultBlindingKeyRequestStruct,cfd::js::api::BlindingKeyResponseStruct>
            (&local_d8,(api *)request,(GetDefaultBlindingKeyRequestStruct *)&local_118,&local_f8,
             in_R8);
  BlindingKeyResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  BlindingKeyResponseStruct::~BlindingKeyResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

BlindingKeyResponseStruct ElementsTransactionStructApi::GetDefaultBlindingKey(
    const GetDefaultBlindingKeyRequestStruct& request) {
  auto call_func = [](const GetDefaultBlindingKeyRequestStruct& request)
      -> BlindingKeyResponseStruct {
    BlindingKeyResponseStruct response;
    Script locking_script;

    if (!request.address.empty() && request.locking_script.empty()) {
      ElementsAddressFactory factory;
      Address address = factory.GetAddress(request.address);
      locking_script = address.GetLockingScript();
    } else {
      locking_script = Script(request.locking_script);
    }
    Privkey blinding_key = ElementsConfidentialAddress::GetBlindingKey(
        Privkey(request.master_blinding_key), locking_script);

    response.blinding_key = blinding_key.GetHex();
    return response;
  };

  BlindingKeyResponseStruct result;
  result = ExecuteStructApi<
      GetDefaultBlindingKeyRequestStruct, BlindingKeyResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}